

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O3

int adl_setNumChips(ADL_MIDIPlayer *device,int numChips)

{
  uint32_t uVar1;
  MIDIplay *play;
  OPL3 *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  string local_40;
  
  if (device == (ADL_MIDIPlayer *)0x0) {
    iVar4 = -2;
  }
  else {
    play = (MIDIplay *)device->adl_midiPlayer;
    if (play == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x86,"int adl_setNumChips(ADL_MIDIPlayer *, int)");
    }
    (play->m_setup).numChips = numChips;
    if (numChips - 0x65U < 0xffffff9c) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"number of chips may only be 1..100.\n","");
      MIDIplay::setErrorString(play,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      iVar4 = -1;
    }
    else {
      iVar3 = numChips * 6;
      iVar4 = (play->m_setup).numFourOps;
      if ((iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == iVar4 + numChips * -6 < 0) ||
         (iVar3 = -1, iVar4 < -1)) {
        (play->m_setup).numFourOps = iVar3;
      }
      this = (play->m_synth).m_p;
      bVar2 = OPL3::setupLocked(this);
      iVar4 = 0;
      if (!bVar2) {
        this->m_numChips = (play->m_setup).numChips;
        uVar1 = (play->m_setup).numFourOps;
        if ((int)uVar1 < 0) {
          adlCalculateFourOpChannels(play,true);
        }
        else {
          this->m_numFourOps = uVar1;
        }
        MIDIplay::partialReset(play);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

ADLMIDI_EXPORT int adl_setNumChips(ADL_MIDIPlayer *device, int numChips)
{
    if(device == NULL)
        return -2;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);

#ifdef ADLMIDI_ENABLE_HW_SERIAL
    if(play->m_setup.serial)
        numChips = 1;
#endif

#ifdef ADLMIDI_HW_OPL
    play->m_setup.numChips = numChips > 2 ? 1 : static_cast<unsigned int>(numChips);
#else
    play->m_setup.numChips = static_cast<unsigned int>(numChips);
#endif

    if((play->m_setup.numChips < 1) || (play->m_setup.numChips > ADL_MAX_CHIPS))
    {
        play->setErrorString("number of chips may only be 1.." ADL_MAX_CHIPS_STR ".\n");
        return -1;
    }

    int maxFourOps = static_cast<int>(play->m_setup.numChips * 6);

    if(play->m_setup.numFourOps > maxFourOps)
        play->m_setup.numFourOps = maxFourOps;
    else if(play->m_setup.numFourOps < -1)
        play->m_setup.numFourOps = -1;

    Synth &synth = *play->m_synth;
    if(!synth.setupLocked())
    {
        synth.m_numChips = play->m_setup.numChips;
        if(play->m_setup.numFourOps < 0)
            adlCalculateFourOpChannels(play, true);
        else
            synth.m_numFourOps = static_cast<uint32_t>(play->m_setup.numFourOps);
        play->partialReset();
        return 0;
    }

    return 0;
}